

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

void __thiscall
psy::C::SyntaxTree::newDiagnostic(SyntaxTree *this,DiagnosticDescriptor *descriptor,IndexType tkIdx)

{
  SyntaxToken *pSVar1;
  SyntaxToken local_c8;
  DiagnosticDescriptor local_88;
  IndexType local_20;
  IndexType tkIdx_local;
  DiagnosticDescriptor *descriptor_local;
  SyntaxTree *this_local;
  
  local_20 = tkIdx;
  tkIdx_local = (IndexType)descriptor;
  descriptor_local = (DiagnosticDescriptor *)this;
  DiagnosticDescriptor::DiagnosticDescriptor(&local_88,descriptor);
  pSVar1 = tokenAt(this,local_20);
  local_c8.field_10 = pSVar1->field_10;
  local_c8.tree_ = pSVar1->tree_;
  local_c8.syntaxK_ = pSVar1->syntaxK_;
  local_c8.byteSize_ = pSVar1->byteSize_;
  local_c8.charSize_ = pSVar1->charSize_;
  local_c8._14_2_ = *(undefined2 *)&pSVar1->field_0xe;
  local_c8.byteOffset_ = pSVar1->byteOffset_;
  local_c8.charOffset_ = pSVar1->charOffset_;
  local_c8.matchingBracket_ = pSVar1->matchingBracket_;
  local_c8.field_7 = pSVar1->field_7;
  local_c8._34_2_ = *(undefined2 *)&pSVar1->field_0x22;
  local_c8.lineno_ = pSVar1->lineno_;
  local_c8.column_ = pSVar1->column_;
  local_c8._44_4_ = *(undefined4 *)&pSVar1->field_0x2c;
  newDiagnostic(this,&local_88,&local_c8);
  SyntaxToken::~SyntaxToken(&local_c8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_88);
  return;
}

Assistant:

void SyntaxTree::newDiagnostic(DiagnosticDescriptor descriptor,
                               LexedTokens::IndexType tkIdx) const
{
    newDiagnostic(descriptor, tokenAt(tkIdx));
}